

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O2

void __thiscall FIX50::Message::Message(Message *this,MsgType *msgtype)

{
  allocator<char> local_89;
  STRING local_88;
  FieldBase local_68;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"FIXT.1.1",&local_89);
  FIX::BeginString::BeginString((BeginString *)&local_68,&local_88);
  FIX::Message::Message(&this->super_Message,(BeginString *)&local_68,msgtype);
  FIX::FieldBase::~FieldBase(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  *(undefined ***)this = &PTR__Message_00150390;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"7",&local_89);
  FIX::ApplVerID::ApplVerID((ApplVerID *)&local_68,&local_88);
  FIX::FieldMap::setField((FieldMap *)&this->field_0x70,&local_68,true);
  FIX::FieldBase::~FieldBase(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

Message( const FIX::MsgType& msgtype )
    : FIX::Message(
      FIX::BeginString("FIXT.1.1"), msgtype )
     { getHeader().setField( FIX::ApplVerID("7") ); }